

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrSig_Constructor_Test::TestBody(SchnorrSig_Constructor_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88 [3];
  ByteData local_70;
  size_t local_58;
  undefined4 local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  SchnorrSignature empty_obj;
  SchnorrSig_Constructor_Test *this_local;
  
  cfd::core::SchnorrSignature::SchnorrSignature((SchnorrSignature *)&gtest_ar.message_);
  local_4c = 0;
  cfd::core::SchnorrSignature::GetData(&local_70,(SchnorrSignature *)&gtest_ar.message_,false);
  local_58 = cfd::core::ByteData::GetDataSize(&local_70);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            (local_48,"0",(int *)"empty_obj.GetData().GetDataSize()",(unsigned_long *)&local_4c,
             &local_58);
  cfd::core::ByteData::~ByteData(&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x58,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(SchnorrSig, Constructor) {
  SchnorrSignature empty_obj;
  EXPECT_EQ(0, empty_obj.GetData().GetDataSize());
}